

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QueryPool.cpp
# Opt level: O1

VkResult __thiscall
myvk::QueryPool::GetResults64(QueryPool *this,uint64_t *data,VkQueryResultFlags flags)

{
  VkResult VVar1;
  
  VVar1 = (*vkGetQueryPoolResults)
                    (((this->m_device_ptr).
                      super___shared_ptr<myvk::Device,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->m_device
                     ,this->m_query_pool,0,this->m_count,(ulong)this->m_count << 3,data,8,flags | 1)
  ;
  return VVar1;
}

Assistant:

VkResult QueryPool::GetResults64(uint64_t *data, VkQueryResultFlags flags) const {
	return GetResults64(0, m_count, data, flags);
}